

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

double flatbuffers::GetAnyValueF(BaseType type,uint8_t *data)

{
  int64_t iVar1;
  double d;
  double local_10;
  
  if (type == String) {
    StringToFloatImpl<double>(&local_10,(char *)(data + (ulong)*(uint *)data + 4));
  }
  else if (type == Double) {
    local_10 = *(double *)data;
  }
  else if (type == Float) {
    local_10 = (double)*(float *)data;
  }
  else {
    iVar1 = GetAnyValueI(type,data);
    local_10 = (double)iVar1;
  }
  return local_10;
}

Assistant:

double GetAnyValueF(reflection::BaseType type, const uint8_t *data) {
  switch (type) {
    case reflection::Float: return static_cast<double>(ReadScalar<float>(data));
    case reflection::Double: return ReadScalar<double>(data);
    case reflection::String: {
      auto s =
          reinterpret_cast<const String *>(ReadScalar<uoffset_t>(data) + data);
      if (s) {
        double d;
        StringToNumber(s->c_str(), &d);
        return d;
      } else {
        return 0.0;
      }
    }
    default: return static_cast<double>(GetAnyValueI(type, data));
  }
}